

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

void report_error(gvisitor_t *self,gnode_t *node,char *format,...)

{
  uint32_t local_56c;
  uint32_t local_55c;
  uint32_t local_54c;
  uint32_t local_53c;
  char local_530 [8];
  undefined8 local_528;
  uint32_t local_51c;
  undefined8 local_468;
  error_desc_t error_desc;
  va_list arg;
  char local_438 [8];
  char buffer [1024];
  gravity_error_callback error_fn;
  void *data;
  codegen_t *current;
  char *format_local;
  gnode_t *node_local;
  gvisitor_t *self_local;
  
  if ((node == (gnode_t *)0x0) || ((node->token).lineno != *(uint32_t *)((long)self->data + 0x30)))
  {
    self->nerr = self->nerr + 1;
    if (node == (gnode_t *)0x0) {
      local_51c = 0;
    }
    else {
      local_51c = (node->token).lineno;
    }
    *(uint32_t *)((long)self->data + 0x30) = local_51c;
    if (self->delegate == (void *)0x0) {
      local_528 = 0;
    }
    else {
      local_528 = *self->delegate;
    }
    if (self->delegate == (void *)0x0) {
      local_530[0] = '\0';
      local_530[1] = '\0';
      local_530[2] = '\0';
      local_530[3] = '\0';
      local_530[4] = '\0';
      local_530[5] = '\0';
      local_530[6] = '\0';
      local_530[7] = '\0';
    }
    else {
      local_530 = *(char (*) [8])((long)self->delegate + 0x20);
    }
    buffer[0x3f8] = local_530[0];
    buffer[0x3f9] = local_530[1];
    buffer[0x3fa] = local_530[2];
    buffer[0x3fb] = local_530[3];
    buffer[0x3fc] = local_530[4];
    buffer[0x3fd] = local_530[5];
    buffer[0x3fe] = local_530[6];
    buffer[0x3ff] = local_530[7];
    if (format != (char *)0x0) {
      error_desc.offset = 0x30;
      error_desc.fileid = 0x18;
      vsnprintf(local_438,0x400,format,&error_desc.fileid);
    }
    if (node == (gnode_t *)0x0) {
      local_53c = 0;
    }
    else {
      local_53c = (node->token).lineno;
    }
    local_468._0_4_ = local_53c;
    if (node == (gnode_t *)0x0) {
      local_54c = 0;
    }
    else {
      local_54c = (node->token).colno;
    }
    local_468._4_4_ = local_54c;
    if (node == (gnode_t *)0x0) {
      local_55c = 0;
    }
    else {
      local_55c = (node->token).fileid;
    }
    error_desc.lineno = local_55c;
    if (node == (gnode_t *)0x0) {
      local_56c = 0;
    }
    else {
      local_56c = (node->token).position;
    }
    error_desc.colno = local_56c;
    if (buffer._1016_8_ == 0) {
      printf("%s\n",local_438);
    }
    else {
      (*(code *)buffer._1016_8_)(0,2,local_438,local_468,error_desc._0_8_,local_528);
    }
  }
  return;
}

Assistant:

static void report_error (gravity_parser_t *parser, error_type_t error_type, gtoken_s token, const char *format, ...) {
    // just one error for each line
    if (parser->last_error_lineno == token.lineno) return;

    // increment internal error counter (and save last reported line) only if it was a real error
    if (error_type != GRAVITY_WARNING) {
        parser->last_error_lineno = token.lineno;
        ++parser->nerrors;
    }

    // get error callback (if any)
    void *data = (parser->delegate) ? parser->delegate->xdata : NULL;
    gravity_error_callback error_fn = (parser->delegate) ? ((gravity_delegate_t *)parser->delegate)->error_callback : NULL;

    // build error message
    char buffer[1024];
    va_list arg;
    if (format) {
        va_start (arg, format);
        vsnprintf(buffer, sizeof(buffer), format, arg);
        va_end (arg);
    }

    // setup error struct
    error_desc_t error_desc = {
        .lineno = token.lineno,
        .colno = token.colno,
        .fileid = token.fileid,
        .offset = token.position
    };

    // finally call error callback
    if (error_fn) error_fn(NULL, error_type, buffer, error_desc, data);
    else printf("%s\n", buffer);
}